

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlidna.cpp
# Opt level: O0

QString * convertToUnicode(QString *asciiDomain,AceProcessingOptions options)

{
  QChar c;
  bool bVar1;
  QString *pQVar2;
  undefined4 in_EDX;
  DomainValidityChecker *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  qsizetype labelLength;
  qsizetype idx;
  qsizetype lastIdx;
  QString unicodeLabel;
  QString label;
  DomainValidityChecker checker;
  QString result;
  undefined4 in_stack_ffffffffffffff08;
  CaseSensitivity in_stack_ffffffffffffff0c;
  QString *in_stack_ffffffffffffff10;
  undefined6 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  QString *in_stack_ffffffffffffff20;
  QString *asize;
  QString *local_a0;
  QString *local_98;
  QString *in_stack_ffffffffffffff78;
  QChar local_6e;
  undefined4 local_6c;
  QChar local_2e;
  DomainValidityChecker local_2c;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  asize = in_RDI;
  local_c = in_EDX;
  QString::QString((QString *)0x30f79c);
  QString::size((QString *)in_RSI);
  QString::reserve(in_stack_ffffffffffffff20,(qsizetype)asize);
  local_98 = (QString *)0x0;
  local_2c.ignoreBidiErrors = true;
  local_2c.domainNameIsBidi = true;
  local_2c.hadBidiErrors = true;
  anon_unknown.dwarf_475472::DomainValidityChecker::DomainValidityChecker(&local_2c,false);
  do {
    QChar::QChar<char16_t,_true>(&local_2e,L'.');
    local_a0 = (QString *)
               QString::indexOf((QString *)
                                CONCAT17(in_stack_ffffffffffffff1f,
                                         CONCAT16(in_stack_ffffffffffffff1e,
                                                  in_stack_ffffffffffffff18)),
                                (QChar)(char16_t)((ulong)asize >> 0x30),
                                (qsizetype)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    if (local_a0 == (QString *)0xffffffffffffffff) {
      local_a0 = (QString *)QString::size((QString *)in_RSI);
    }
    if (local_a0 == local_98) {
      in_stack_ffffffffffffff20 = local_a0;
      pQVar2 = (QString *)QString::size((QString *)in_RSI);
      if (in_stack_ffffffffffffff20 == pQVar2) {
LAB_0030fa8a:
        QString::QString(in_stack_ffffffffffffff10,
                         (QString *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
LAB_0030faa4:
        QString::~QString((QString *)0x30fab1);
        if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
          __stack_chk_fail();
        }
        return in_RDI;
      }
    }
    else {
      QString::sliced(in_stack_ffffffffffffff20,
                      CONCAT17(in_stack_ffffffffffffff1f,
                               CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18)),
                      (qsizetype)in_stack_ffffffffffffff10);
      qt_punycodeDecoder((QString *)&DAT_aaaaaaaaaaaaaaaa);
      bVar1 = QString::isEmpty((QString *)0x30f924);
      if (bVar1) {
        QString::QString(in_stack_ffffffffffffff10,
                         (QString *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        bVar1 = true;
      }
      else {
        local_6c = local_c;
        in_stack_ffffffffffffff1f =
             anon_unknown.dwarf_475472::DomainValidityChecker::checkLabel
                       (in_RSI,in_stack_ffffffffffffff78,idx._4_4_);
        if ((bool)in_stack_ffffffffffffff1f) {
          QString::append((QString *)
                          CONCAT17(in_stack_ffffffffffffff1f,
                                   CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18)),
                          in_stack_ffffffffffffff10);
          bVar1 = false;
        }
        else {
          QString::QString(in_stack_ffffffffffffff10,
                           (QString *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
          ;
          bVar1 = true;
        }
      }
      QString::~QString((QString *)0x30f9fd);
      QString::~QString((QString *)0x30fa0a);
      if (bVar1) goto LAB_0030faa4;
    }
    in_stack_ffffffffffffff10 = local_a0;
    pQVar2 = (QString *)QString::size((QString *)in_RSI);
    if (in_stack_ffffffffffffff10 == pQVar2) goto LAB_0030fa8a;
    local_98 = (QString *)((long)&(local_a0->d).d + 1);
    QChar::QChar<char16_t,_true>(&local_6e,L'.');
    c.ucs._1_1_ = in_stack_ffffffffffffff1f;
    c.ucs._0_1_ = in_stack_ffffffffffffff1e;
    QString::operator+=(in_stack_ffffffffffffff10,c);
  } while( true );
}

Assistant:

static QString convertToUnicode(const QString &asciiDomain, QUrl::AceProcessingOptions options)
{
    QString result;
    result.reserve(asciiDomain.size());
    qsizetype lastIdx = 0;

    DomainValidityChecker checker;

    while (true) {
        auto idx = asciiDomain.indexOf(u'.', lastIdx);
        if (idx == -1)
            idx = asciiDomain.size();

        const auto labelLength = idx - lastIdx;
        if (labelLength == 0) {
            if (idx == asciiDomain.size())
                break;
        } else {
            const auto label = asciiDomain.sliced(lastIdx, labelLength);
            const auto unicodeLabel = qt_punycodeDecoder(label);

            if (unicodeLabel.isEmpty())
                return asciiDomain;

            if (!checker.checkLabel(unicodeLabel, options))
                return asciiDomain;

            result.append(unicodeLabel);
        }

        if (idx == asciiDomain.size())
            break;

        lastIdx = idx + 1;
        result += u'.';
    }
    return result;
}